

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_resolver_entry.hpp
# Opt level: O3

void __thiscall
asio::ip::basic_resolver_entry<asio::ip::udp>::basic_resolver_entry
          (basic_resolver_entry<asio::ip::udp> *this,endpoint_type *ep,string_view host,
          string_view service)

{
  undefined4 uVar1;
  in_addr_t iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  uint32_t uVar7;
  
  uVar1 = *(undefined4 *)&(ep->impl_).data_;
  iVar2 = (ep->impl_).data_.v4.sin_addr.s_addr;
  uVar3 = *(undefined4 *)((long)&(ep->impl_).data_ + 8);
  uVar4 = *(undefined4 *)((long)&(ep->impl_).data_ + 0xc);
  uVar5 = *(undefined4 *)((long)&(ep->impl_).data_ + 0x10);
  uVar6 = *(undefined4 *)((long)&(ep->impl_).data_ + 0x14);
  uVar7 = (ep->impl_).data_.v6.sin6_scope_id;
  *(undefined4 *)((long)&(this->endpoint_).impl_.data_ + 0xc) =
       *(undefined4 *)((long)&(ep->impl_).data_ + 0xc);
  *(undefined4 *)((long)&(this->endpoint_).impl_.data_ + 0x10) = uVar5;
  *(undefined4 *)((long)&(this->endpoint_).impl_.data_ + 0x14) = uVar6;
  (this->endpoint_).impl_.data_.v6.sin6_scope_id = uVar7;
  *(undefined4 *)&(this->endpoint_).impl_.data_ = uVar1;
  (this->endpoint_).impl_.data_.v4.sin_addr.s_addr = iVar2;
  *(undefined4 *)((long)&(this->endpoint_).impl_.data_ + 8) = uVar3;
  *(undefined4 *)((long)&(this->endpoint_).impl_.data_ + 0xc) = uVar4;
  (this->host_name_)._M_dataplus._M_p = (pointer)&(this->host_name_).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->host_name_,host._M_str,host._M_str + host._M_len);
  (this->service_name_)._M_dataplus._M_p = (pointer)&(this->service_name_).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->service_name_,service._M_str,service._M_str + service._M_len);
  return;
}

Assistant:

basic_resolver_entry(const endpoint_type& ep,
      ASIO_STRING_VIEW_PARAM host, ASIO_STRING_VIEW_PARAM service)
    : endpoint_(ep),
      host_name_(static_cast<std::string>(host)),
      service_name_(static_cast<std::string>(service))
  {
  }